

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool __thiscall tinyusdz::Prim::add_child(Prim *this,Prim *rhs,bool rename_prim_name,string *err)

{
  Path *this_00;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  string *in;
  long lVar8;
  ulong uVar9;
  pointer pPVar10;
  string unique_name;
  string elementName;
  string local_168;
  key_type local_148;
  string local_128;
  Path *local_108;
  Path local_100;
  
  this_00 = &rhs->_elementPath;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  pcVar3 = (rhs->_elementPath)._prim_part._M_dataplus._M_p;
  pcVar6 = (char *)err;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,pcVar3 + (rhs->_elementPath)._prim_part._M_string_length);
  if (local_148._M_string_length == 0) {
    if (rename_prim_name) {
      pcVar6 = "default";
      ::std::__cxx11::string::_M_replace((ulong)&local_148,0,(char *)0x0,0x3d7225);
      bVar4 = SetPrimElementName(&rhs->_data,&local_148);
      if (bVar4) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
        Path::Path(&local_100,&local_148,&local_168);
        Path::operator=(this_00,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
          operator_delete(local_100._element._M_dataplus._M_p,
                          local_100._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part_str._M_dataplus._M_p != &local_100._variant_part_str.field_2)
        {
          operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                          local_100._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_selection_part._M_dataplus._M_p !=
            &local_100._variant_selection_part.field_2) {
          operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                          local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
          operator_delete(local_100._variant_part._M_dataplus._M_p,
                          local_100._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
          operator_delete(local_100._prop_part._M_dataplus._M_p,
                          local_100._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          local_100._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0028c32e;
      }
      if (err == (string *)0x0) goto LAB_0028c874;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"Internal error. cannot modify Prim\'s elementName.\n","");
      fmt::format(&local_100._prim_part,&local_168);
LAB_0028c835:
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
        operator_delete(local_100._prim_part._M_dataplus._M_p,
                        local_100._prim_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_0028c867;
    }
    else if (err != (string *)0x0) {
      bVar4 = false;
      ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x3e217f);
      goto LAB_0028c909;
    }
  }
  else {
LAB_0028c32e:
    this_01 = &this->_childrenNameSet;
    local_108 = this_00;
    if (((long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d -
        (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_01,
                 (_Link_type)
                 (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
      pcVar6 = (char *)0x0;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pPVar10 = (this->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish != pPVar10) {
        lVar8 = 0x1a0;
        uVar9 = 0;
        do {
          if (*(long *)((long)&(pPVar10->_abs_path)._prim_part._M_string_length + lVar8) == 0) {
            if (err != (string *)0x0) {
              pcVar6 = (char *)err->_M_string_length;
              pcVar7 = "Internal error: Existing child Prim\'s elementName is empty.\n";
LAB_0028c8f8:
              ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar6,(ulong)pcVar7);
            }
LAB_0028c904:
            bVar4 = false;
            goto LAB_0028c909;
          }
          sVar5 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_01,
                          (key_type *)
                          ((long)&(pPVar10->_abs_path)._prim_part._M_dataplus._M_p + lVar8));
          if (sVar5 != 0) {
            if (err != (string *)0x0) {
              pcVar6 = (char *)err->_M_string_length;
              pcVar7 = "Internal error: _children contains Prim with same elementName.\n";
              goto LAB_0028c8f8;
            }
            goto LAB_0028c904;
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_equal<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_01,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->_children).
                               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_abs_path)._prim_part.
                             _M_dataplus + lVar8));
          uVar9 = uVar9 + 1;
          pPVar10 = (this->_children).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x350;
        } while (uVar9 < (ulong)(((long)(this->_children).
                                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar10
                                 >> 4) * 0x21cfb2b78c13521d));
      }
    }
    sVar5 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01,&local_148);
    if (sVar5 == 0) {
LAB_0028c5e4:
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_equal<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_01,&local_148);
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&this->_children,rhs);
      this->_child_dirty = true;
      bVar4 = true;
      goto LAB_0028c909;
    }
    if (!rename_prim_name) {
      if (err != (string *)0x0) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"Prim name(elementName) {} already exists in children.\n",""
                  );
        fmt::format<std::__cxx11::string>
                  ((string *)&local_100,(fmt *)&local_168,(string *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar6);
        goto LAB_0028c835;
      }
      goto LAB_0028c874;
    }
    paVar2 = &local_168.field_2;
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    local_168._M_dataplus._M_p = (pointer)paVar2;
    bVar4 = makeUniqueName(this_01,&local_148,&local_168);
    if (bVar4) {
      bVar4 = ValidatePrimElementName(&local_168);
      if (bVar4) {
        ::std::__cxx11::string::_M_assign((string *)&local_148);
        bVar4 = SetPrimElementName(&rhs->_data,&local_148);
        if (bVar4) {
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
          Path::Path(&local_100,&local_148,&local_128);
          Path::operator=(local_108,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
            operator_delete(local_100._element._M_dataplus._M_p,
                            local_100._element.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._variant_part_str._M_dataplus._M_p !=
              &local_100._variant_part_str.field_2) {
            operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                            local_100._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._variant_selection_part._M_dataplus._M_p !=
              &local_100._variant_selection_part.field_2) {
            operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                            local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
            operator_delete(local_100._variant_part._M_dataplus._M_p,
                            local_100._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
            operator_delete(local_100._prop_part._M_dataplus._M_p,
                            local_100._prop_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
            operator_delete(local_100._prim_part._M_dataplus._M_p,
                            local_100._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar2) {
            operator_delete(local_168._M_dataplus._M_p,
                            CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                     local_168.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_0028c5e4;
        }
        if (err == (string *)0x0) goto LAB_0028c9b9;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"Internal error. cannot modify Prim\'s elementName.\n","");
        fmt::format(&local_100._prim_part,&local_128);
LAB_0028c977:
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          local_100._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      else if (err != (string *)0x0) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,
                   "Internally generated Prim name `{}` is invalid as a Prim name.\n","");
        in = (string *)&local_168;
        goto LAB_0028c96c;
      }
    }
    else if (err != (string *)0x0) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"Internal error. cannot assign unique name for `{}`.\n","");
      in = (string *)&local_148;
LAB_0028c96c:
      fmt::format<std::__cxx11::string>
                ((string *)&local_100,(fmt *)&local_128,in,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar6);
      goto LAB_0028c977;
    }
LAB_0028c9b9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar2) {
LAB_0028c867:
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_0028c874:
  bVar4 = false;
LAB_0028c909:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool Prim::add_child(Prim &&rhs, const bool rename_prim_name,
                     std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  std::string elementName = rhs.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {
      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = "Prim has empty elementName.\n";
      }
      return false;
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  DCOUT("elementName = " << elementName);

  if (_childrenNameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_childrenNameSet, elementName, &unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot assign unique name for `{}`.\n",
              elementName);
        }
        return false;
      }

      // Ensure valid Prim name
      if (!ValidatePrimElementName(unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internally generated Prim name `{}` is invalid as a Prim "
              "name.\n",
              unique_name);
        }
        return false;
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      DCOUT("elementName = " << elementName);
      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = fmt::format(
            "Prim name(elementName) {} already exists in children.\n",
            rhs.element_name());
      }
      return false;
    }
  }

  DCOUT("rhs.elementName = " << rhs.element_name());

  _childrenNameSet.insert(elementName);
  _children.emplace_back(std::move(rhs));
  _child_dirty = true;

  return true;
}